

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * cmsys::regnode(char op)

{
  char *pcVar1;
  char *pcVar2;
  char *ptr;
  char *ret;
  char op_local;
  
  pcVar1 = regcode;
  if (regcode == &regdummy) {
    regsize = regsize + 3;
  }
  else {
    *regcode = op;
    pcVar2 = regcode + 2;
    regcode[1] = '\0';
    regcode = regcode + 3;
    *pcVar2 = '\0';
  }
  return pcVar1;
}

Assistant:

static char* regnode (char op) {
    char* ret;
    char* ptr;

    ret = regcode;
    if (ret == &regdummy) {
        regsize += 3;
        return (ret);
    }

    ptr = ret;
    *ptr++ = op;
    *ptr++ = '\0';              // Null "next" pointer.
    *ptr++ = '\0';
    regcode = ptr;

    return (ret);
}